

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_S2C_RESPONSE_check(void)

{
  int32_t iVar1;
  uint8_t local_12e [6];
  undefined1 local_128 [2];
  uint8_t buf3 [3];
  uint8_t buf2 [2];
  uint8_t buf1 [1];
  PipeMsg msg;
  
  MsgHelper::initMsg((PipeMsg *)local_128,S2C_RESPONSE);
  local_12e[5] = 2;
  iVar1 = MsgHelper::deserializeMsg(local_12e + 5,1,(PipeMsg *)local_128);
  if (iVar1 != 0) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xbc,"void test_S2C_RESPONSE_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)local_128);
  local_12e[3] = '\x02';
  local_12e[4] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(local_12e + 3,2,(PipeMsg *)local_128);
  if (iVar1 == -1) {
    MsgHelper::destroyMsg((PipeMsg *)local_128);
    local_12e[0] = '\x02';
    local_12e[1] = '\x02';
    local_12e[2] = 3;
    iVar1 = MsgHelper::deserializeMsg(local_12e,3,(PipeMsg *)local_128);
    if (iVar1 == 2) {
      MsgHelper::destroyMsg((PipeMsg *)local_128);
      return;
    }
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xc5,"void test_S2C_RESPONSE_check()");
  }
  __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0xc1,"void test_S2C_RESPONSE_check()");
}

Assistant:

void test_S2C_RESPONSE_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::S2C_RESPONSE);
	
	const uint8_t buf1[] = {0x02};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
	
	// error: code(0x05) >= S2C_RESPONSE_CODE::CODE_NONE
	const uint8_t buf2[] = {0x02, 0x05};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf3[] = {0x02, 0x02, 0x03};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 2);
	MsgHelper::destroyMsg(&msg);
}